

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O0

string_t duckdb::URLEncodeOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  string_t *this;
  idx_t input_size_00;
  idx_t result_length;
  idx_t input_size;
  char *input_str;
  string_t result_str;
  string_t *this_00;
  undefined1 encode_slash;
  Vector *in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  string_t local_20;
  anon_union_16_2_67f50693_for_value local_10;
  
  this_00 = &local_20;
  this = (string_t *)string_t::GetData((string_t *)in_stack_ffffffffffffffa0);
  input_size_00 = string_t::GetSize(this_00);
  uVar1 = 1;
  StringUtil::URLEncodeSize
            ((char *)CONCAT44(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
             SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  local_10.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(in_stack_ffffffffffffffa0,(idx_t)this_00);
  encode_slash = (undefined1)((ulong)this_00 >> 0x38);
  string_t::GetDataWriteable(this);
  StringUtil::URLEncodeBuffer
            ((char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),input_size_00,(char *)this,
             (bool)encode_slash);
  string_t::Finalize((string_t *)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_str = input.GetData();
		auto input_size = input.GetSize();
		idx_t result_length = StringUtil::URLEncodeSize(input_str, input_size);
		auto result_str = StringVector::EmptyString(result, result_length);
		StringUtil::URLEncodeBuffer(input_str, input_size, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}